

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_compression.cc
# Opt level: O0

int anon_unknown.dwarf_39b09c::SiTitoPiQi(uint si,int level)

{
  uint *puVar1;
  uint local_14;
  int local_10;
  uint local_c;
  int level_local;
  uint si_local;
  
  local_14 = 0x7fffffff;
  local_10 = level;
  local_c = si;
  puVar1 = std::min<unsigned_int>(&local_c,&local_14);
  return *puVar1 >> (0x1fU - (char)local_10 & 0x1f);
}

Assistant:

inline int SiTitoPiQi(unsigned int si, int level) {
  // See STtoPiQi for the definition of the PiQi coordinate system.
  //
  // EncodeFirstPointFixedLength encodes the return value using "level" bits,
  // so we clamp "si" to the range [0, 2**level - 1] before trying to encode
  // it.  This is okay because if si == kMaxSiTi, then it is not a cell center
  // anyway and will be encoded separately as an "off-center" point.
  si = std::min(si, S2::kMaxSiTi - 1);
  return si >> (S2::kMaxCellLevel + 1 - level);
}